

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverManager.h
# Opt level: O0

void ObserverManager::unsubscribe<A>(A *observer)

{
  bool bVar1;
  pointer ppVar2;
  _func_void_BaseObserverProtocol_ptr *ptr;
  _Node_iterator_base<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_false>
  local_20;
  iterator it;
  id_t id;
  A *observer_local;
  
  if (observer != (A *)0x0) {
    it.
    super__Node_iterator_base<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_false>
               )(observer->super_FooBarProtocol).super_BaseObserverProtocol.observerId;
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_void_(*)(BaseObserverProtocol_*),_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>_>_>
         ::find(&unsubscribeMap,(key_type *)&it);
    ptr = (_func_void_BaseObserverProtocol_ptr *)
          std::
          end<std::unordered_map<unsigned_long,void(*)(BaseObserverProtocol*),std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void(*)(BaseObserverProtocol*)>>>>
                    (&unsubscribeMap);
    bVar1 = std::__detail::operator==
                      (&local_20,
                       (_Node_iterator_base<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_false>
                        *)&ptr);
    if (!bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_false,_false>
                             *)&local_20);
      if (ppVar2->second != (_func_void_BaseObserverProtocol_ptr *)0x0) {
        (*ppVar2->second)((BaseObserverProtocol *)observer);
      }
      std::
      unordered_map<unsigned_long,_void_(*)(BaseObserverProtocol_*),_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>_>_>
      ::erase(&unsubscribeMap,(key_type *)&it);
    }
  }
  return;
}

Assistant:

static void unsubscribe(P* observer) {
        if (observer == nullptr) {
            return;
        }

        auto id = observer->P::observerId;
        auto it = unsubscribeMap.find(id);
        if (it == std::end(unsubscribeMap)) {
            return;
        }

        auto ptr = it->second;
        if (ptr != nullptr) {
            ptr(observer);
        }

        unsubscribeMap.erase(id);
    }